

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<double,double,double,duckdb::BinaryZeroIsNullWrapper,duckdb::DivideOperator,bool,true,false>
               (double *ldata,double *rdata,double *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  double dVar1;
  ulong uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  byte bVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  _Head_base<0UL,_unsigned_long_*,_false> _Var8;
  ulong uVar9;
  ulong uVar10;
  double *pdVar11;
  double *pdVar12;
  idx_t idx_in_entry_1;
  ulong uVar13;
  idx_t idx_in_entry;
  ulong uVar14;
  buffer_ptr<ValidityBuffer> *pbVar15;
  double dVar16;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  double *local_88;
  idx_t local_80;
  buffer_ptr<ValidityBuffer> *local_78;
  double *local_70;
  double local_68;
  double *local_60;
  idx_t local_58;
  ulong local_50;
  double *local_48;
  double *local_40;
  ulong local_38;
  
  _Var8._M_head_impl = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_70 = rdata;
  local_60 = ldata;
  if (_Var8._M_head_impl == (unsigned_long *)0x0) {
    if (count != 0) {
      pbVar15 = (buffer_ptr<ValidityBuffer> *)*ldata;
      _Var8._M_head_impl = (unsigned_long *)0x0;
      uVar14 = 0;
      local_78 = pbVar15;
      do {
        dVar16 = local_70[uVar14];
        if ((dVar16 != 0.0) || (NAN(dVar16))) {
          dVar16 = (double)pbVar15 / dVar16;
        }
        else {
          if (_Var8._M_head_impl == (unsigned_long *)0x0) {
            local_80 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_98,&local_80);
            p_Var6 = p_Stack_90;
            peVar5 = local_98;
            local_98 = (element_type *)0x0;
            p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar5;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var6;
            if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
               p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
            }
            pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                               (&(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
            _Var8._M_head_impl =
                 (pTVar7->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var8._M_head_impl;
            pbVar15 = local_78;
          }
          bVar4 = (byte)uVar14 & 0x3f;
          _Var8._M_head_impl[uVar14 >> 6] =
               _Var8._M_head_impl[uVar14 >> 6] &
               (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
          dVar16 = (double)pbVar15;
        }
        result_data[uVar14] = dVar16;
        uVar14 = uVar14 + 1;
      } while (count != uVar14);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_50 = count + 0x3f >> 6;
    local_78 = &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    local_38 = 0;
    uVar14 = 0;
    local_88 = result_data;
    local_58 = count;
    do {
      pdVar11 = local_70;
      if (_Var8._M_head_impl == (unsigned_long *)0x0) {
        uVar9 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar9 = count;
        }
LAB_009c3deb:
        uVar10 = uVar14;
        if (uVar14 < uVar9) {
          dVar16 = *local_60;
          local_68 = dVar16;
          do {
            dVar1 = pdVar11[uVar14];
            if ((dVar1 != 0.0) || (NAN(dVar1))) {
              dVar1 = dVar16 / dVar1;
            }
            else {
              if (_Var8._M_head_impl == (unsigned_long *)0x0) {
                local_80 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_98,&local_80);
                p_Var6 = p_Stack_90;
                peVar5 = local_98;
                local_98 = (element_type *)0x0;
                p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = peVar5;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = p_Var6;
                if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
                   p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                }
                pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                   (local_78);
                _Var8._M_head_impl =
                     (pTVar7->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                     _Var8._M_head_impl;
                dVar16 = local_68;
              }
              bVar4 = (byte)uVar14 & 0x3f;
              _Var8._M_head_impl[uVar14 >> 6] =
                   _Var8._M_head_impl[uVar14 >> 6] &
                   (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
              dVar1 = dVar16;
            }
            result_data[uVar14] = dVar1;
            uVar14 = uVar14 + 1;
            uVar10 = uVar9;
          } while (uVar9 != uVar14);
        }
      }
      else {
        uVar2 = _Var8._M_head_impl[local_38];
        uVar9 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar9 = count;
        }
        uVar10 = uVar9;
        result_data = local_88;
        if (uVar2 != 0) {
          if (uVar2 == 0xffffffffffffffff) goto LAB_009c3deb;
          uVar10 = uVar14;
          count = local_58;
          if (uVar14 < uVar9) {
            pdVar11 = local_88 + uVar14;
            pdVar12 = local_70 + uVar14;
            uVar13 = 0;
            local_48 = pdVar12;
            local_40 = pdVar11;
            do {
              if ((uVar2 >> (uVar13 & 0x3f) & 1) != 0) {
                local_68 = *local_60;
                dVar16 = pdVar12[uVar13];
                if ((dVar16 != 0.0) || (NAN(dVar16))) {
                  local_68 = local_68 / dVar16;
                }
                else {
                  if (_Var8._M_head_impl == (unsigned_long *)0x0) {
                    local_80 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)&local_98,&local_80);
                    p_Var6 = p_Stack_90;
                    peVar5 = local_98;
                    local_98 = (element_type *)0x0;
                    p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                             internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = peVar5;
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = p_Var6;
                    if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                       (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
                       p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                    }
                    pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                             operator->(local_78);
                    _Var8._M_head_impl =
                         (pTVar7->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                         _Var8._M_head_impl;
                    pdVar11 = local_40;
                    pdVar12 = local_48;
                  }
                  bVar4 = (byte)(uVar14 + uVar13) & 0x3f;
                  _Var8._M_head_impl[uVar14 + uVar13 >> 6] =
                       _Var8._M_head_impl[uVar14 + uVar13 >> 6] &
                       (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
                }
                pdVar11[uVar13] = local_68;
              }
              uVar13 = uVar13 + 1;
              uVar10 = uVar9;
              count = local_58;
              result_data = local_88;
            } while (uVar9 - uVar14 != uVar13);
          }
        }
      }
      local_38 = local_38 + 1;
      uVar14 = uVar10;
    } while (local_38 != local_50);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}